

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void set_get_max_keylen(void)

{
  size_t *psVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *fconfig_00;
  fdb_config *pfVar6;
  size_t metalen;
  size_t bodylen;
  uint uVar7;
  ulong unaff_RBP;
  char *pcVar8;
  fdb_doc *pfVar9;
  fdb_kvs_handle **unaff_R12;
  fdb_file_handle **ptr_fhandle;
  ulong uVar10;
  fdb_kvs_handle *unaff_R13;
  fdb_config *pfVar11;
  char *unaff_R15;
  char *kvs_config_00;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t rvalue_len;
  void *rvalue;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [65408];
  fdb_doc *pfStack_117b8;
  fdb_kvs_handle *pfStack_117b0;
  fdb_file_handle *pfStack_117a8;
  timeval tStack_117a0;
  fdb_kvs_config fStack_11790;
  fdb_config fStack_11778;
  char acStack_11680 [256];
  char *pcStack_11580;
  fdb_config *pfStack_11578;
  fdb_config *pfStack_11570;
  fdb_file_handle *pfStack_11560;
  fdb_kvs_handle *pfStack_11558;
  fdb_kvs_config fStack_11550;
  timeval tStack_11538;
  char acStack_11528 [264];
  fdb_config fStack_11420;
  char acStack_11328 [256];
  char acStack_11228 [264];
  char *pcStack_11120;
  fdb_file_handle **ppfStack_11118;
  fdb_kvs_handle *pfStack_11110;
  fdb_config *pfStack_11108;
  fdb_kvs_config *pfStack_11100;
  code *pcStack_110f8;
  fdb_kvs_handle *pfStack_110e0;
  fdb_file_handle *pfStack_110d8;
  fdb_iterator *pfStack_110d0;
  timeval tStack_110c8;
  fdb_kvs_config fStack_110b8;
  fdb_file_handle *apfStack_110a0 [32];
  fdb_config fStack_10fa0;
  fdb_config fStack_10e98;
  char acStack_10da0 [264];
  fdb_config *pfStack_10c98;
  fdb_kvs_handle **ppfStack_10c90;
  fdb_kvs_handle *pfStack_10c88;
  fdb_config *pfStack_10c80;
  char *pcStack_10c78;
  code *pcStack_10c70;
  fdb_file_handle *pfStack_10c60;
  fdb_kvs_handle *pfStack_10c58;
  fdb_doc *pfStack_10c50;
  undefined1 auStack_10c48 [40];
  fdb_seqnum_t fStack_10c20;
  uint64_t uStack_10c18;
  void *pvStack_10c10;
  fdb_config *pfStack_10c08;
  uint64_t uStack_10c00;
  fdb_kvs_config fStack_10bf8;
  timeval tStack_10be0;
  undefined1 auStack_10bd0 [72];
  fdb_config fStack_10b88;
  char acStack_10a88 [256];
  fdb_config fStack_10988;
  fdb_config *pfStack_10890;
  fdb_config *pfStack_10888;
  fdb_doc *pfStack_10870;
  fdb_kvs_handle *pfStack_10868;
  fdb_file_handle *pfStack_10860;
  fdb_doc *pfStack_10858;
  undefined1 auStack_10850 [40];
  fdb_seqnum_t fStack_10828;
  uint64_t uStack_10820;
  fdb_compaction_callback p_Stack_10818;
  fdb_config *pfStack_10810;
  void *pvStack_10808;
  fdb_kvs_config fStack_107f8;
  timeval tStack_107e0;
  uint8_t auStack_107d0 [256];
  fdb_config fStack_106d0;
  fdb_config fStack_105d0;
  fdb_config *pfStack_104d8;
  fdb_config *pfStack_104d0;
  fdb_file_handle *pfStack_104c0;
  fdb_kvs_handle *pfStack_104b8;
  size_t sStack_104b0;
  int *piStack_104a8;
  timeval tStack_104a0;
  fdb_config fStack_10490;
  fdb_kvs_handle *pfStack_10398;
  fdb_file_handle *pfStack_10390;
  int iStack_10384;
  fdb_kvs_handle *pfStack_10380;
  fdb_kvs_config fStack_10378;
  timeval tStack_10360;
  undefined1 auStack_10350 [76];
  int iStack_10304;
  docio_handle *pdStack_10300;
  uint64_t uStack_10298;
  fdb_config fStack_10210;
  fdb_kvs_handle *pfStack_10108;
  fdb_kvs_handle *pfStack_100d8;
  fdb_file_handle *pfStack_100d0;
  size_t sStack_100c8;
  void *pvStack_100c0;
  fdb_kvs_config fStack_100b8;
  timeval tStack_100a0;
  fdb_kvs_handle afStack_10090 [126];
  undefined1 local_19;
  
  gettimeofday(&tStack_100a0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fconfig_00 = afStack_10090;
  fdb_get_default_config();
  afStack_10090[0].kvs_config.create_if_missing = true;
  afStack_10090[0].kvs_config._1_1_ = 0;
  system("rm -rf  dummy* > errorlog.txt");
  memset(&afStack_10090[0].config.num_bgflusher_threads,0x61,0xff80);
  local_19 = 0;
  fVar2 = fdb_open(&pfStack_100d0,"./dummy1",(fdb_config *)fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_100d0,&pfStack_100d8,&fStack_100b8);
    handle = pfStack_100d8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fff5;
    psVar1 = &afStack_10090[0].config.num_bgflusher_threads;
    sVar4 = strlen((char *)psVar1);
    fVar2 = fdb_set_kv(handle,psVar1,sVar4,(void *)0x0,0);
    fconfig_00 = handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fffa;
    fVar2 = fdb_get(pfStack_100d8,(fdb_doc *)0x0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_0010ffff;
    psVar1 = &afStack_10090[0].config.num_bgflusher_threads;
    sVar4 = strlen((char *)psVar1);
    fVar2 = fdb_get_kv(pfStack_100d8,psVar1,sVar4,&pvStack_100c0,&sStack_100c8);
    fconfig_00 = pfStack_100d8;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_100d0);
      fdb_shutdown();
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar8,"set get max keylen");
      return;
    }
  }
  else {
    set_get_max_keylen();
LAB_0010fff5:
    set_get_max_keylen();
LAB_0010fffa:
    set_get_max_keylen();
LAB_0010ffff:
    set_get_max_keylen();
  }
  pfVar11 = (fdb_config *)&afStack_10090[0].config.num_bgflusher_threads;
  set_get_max_keylen();
  pfStack_10398 = (fdb_kvs_handle *)0x110026;
  pfStack_10108 = fconfig_00;
  gettimeofday(&tStack_10360,(__timezone_ptr_t)0x0);
  pfStack_10398 = (fdb_kvs_handle *)0x11002b;
  memleak_start();
  pfStack_10398 = (fdb_kvs_handle *)0x110037;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10398 = (fdb_kvs_handle *)0x11003c;
  sVar5 = fdb_get_buffer_cache_used();
  if (sVar5 == 0) {
    fconfig_00 = (fdb_kvs_handle *)&fStack_10210;
    pfStack_10398 = (fdb_kvs_handle *)0x110055;
    fdb_get_default_config();
    pfVar11 = (fdb_config *)(auStack_10350 + 0x48);
    pfStack_10398 = (fdb_kvs_handle *)0x11006d;
    memcpy(pfVar11,fconfig_00,0xf8);
    pdStack_10300 = (docio_handle *)0xffffffffffffffff;
    pfStack_10398 = (fdb_kvs_handle *)0x110087;
    fVar2 = fdb_open(&pfStack_10390,"./dummy1",pfVar11);
    if (fVar2 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_001102ee;
    fconfig_00 = (fdb_kvs_handle *)&fStack_10210;
    pfStack_10398 = (fdb_kvs_handle *)0x1100a0;
    fdb_get_default_config();
    pfVar11 = (fdb_config *)(auStack_10350 + 0x48);
    pfStack_10398 = (fdb_kvs_handle *)0x1100b8;
    memcpy(pfVar11,fconfig_00,0xf8);
    uStack_10298 = 0x78;
    pfStack_10398 = (fdb_kvs_handle *)0x1100d2;
    fVar2 = fdb_open(&pfStack_10390,"./dummy1",pfVar11);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_001102f3;
    pfVar11 = &fStack_10210;
    pfStack_10398 = (fdb_kvs_handle *)0x1100eb;
    fdb_get_default_config();
    pfStack_10398 = (fdb_kvs_handle *)0x110100;
    memcpy(auStack_10350 + 0x48,pfVar11,0xf8);
    pfStack_10398 = (fdb_kvs_handle *)0x11010a;
    fdb_get_default_kvs_config();
    unaff_RBP = 4;
    unaff_R15 = "justonekv";
    unaff_R12 = &pfStack_10380;
    unaff_R13 = (fdb_kvs_handle *)auStack_10350;
    do {
      pfStack_10398 = (fdb_kvs_handle *)0x110133;
      sprintf((char *)pfVar11,"dummy%d",unaff_RBP);
      pfStack_10398 = (fdb_kvs_handle *)0x110146;
      fVar2 = fdb_open(&pfStack_10390,(char *)pfVar11,(fdb_config *)(auStack_10350 + 0x48));
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001102da:
        pfStack_10398 = (fdb_kvs_handle *)0x1102df;
        config_test();
LAB_001102df:
        pfStack_10398 = (fdb_kvs_handle *)0x1102e4;
        config_test();
LAB_001102e4:
        pfStack_10398 = (fdb_kvs_handle *)0x1102e9;
        config_test();
        goto LAB_001102e9;
      }
      pfStack_10398 = (fdb_kvs_handle *)0x110162;
      fVar2 = fdb_kvs_open(pfStack_10390,unaff_R12,"justonekv",&fStack_10378);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_10398 = (fdb_kvs_handle *)0x1102da;
        config_test();
        goto LAB_001102da;
      }
      pfStack_10398 = (fdb_kvs_handle *)0x11016f;
      fconfig_00 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pfStack_10398 = (fdb_kvs_handle *)0x11017e;
      fVar2 = fdb_get_file_info(pfStack_10390,(fdb_file_info *)unaff_R13);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102e4;
      iVar3 = iStack_10304;
      if ((fdb_file_handle *)auStack_10350._40_8_ !=
          (fdb_file_handle *)(ulong)(uint)(iStack_10304 * 7)) {
        pfStack_10398 = (fdb_kvs_handle *)0x1101d6;
        config_test();
        iVar3 = iStack_10384;
      }
      if (fconfig_00 != (fdb_kvs_handle *)(ulong)(uint)(iVar3 * 2)) {
        pfStack_10398 = (fdb_kvs_handle *)0x1101ec;
        config_test();
      }
      pfStack_10398 = (fdb_kvs_handle *)0x1101ad;
      fVar2 = fdb_close(pfStack_10390);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102df;
      uVar7 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar7;
    } while (uVar7 != 0);
    pfStack_10398 = (fdb_kvs_handle *)0x110206;
    fVar2 = fdb_open(&pfStack_10390,(char *)&fStack_10210,(fdb_config *)(auStack_10350 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102f8;
    pfStack_10398 = (fdb_kvs_handle *)0x110228;
    fVar2 = fdb_kvs_open(pfStack_10390,&pfStack_10380,"justonekv",&fStack_10378);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102fd;
    pfStack_10398 = (fdb_kvs_handle *)0x110253;
    fVar2 = fdb_set_kv(pfStack_10380,"key",3,"body",5);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10398 = (fdb_kvs_handle *)0x110260;
      sVar5 = fdb_get_buffer_cache_used();
      if (sVar5 != (uint)(iStack_10304 << 3)) {
        pfStack_10398 = (fdb_kvs_handle *)0x11027f;
        config_test();
      }
      pfStack_10398 = (fdb_kvs_handle *)0x110288;
      fdb_close(pfStack_10390);
      pfStack_10398 = (fdb_kvs_handle *)0x11028d;
      fdb_shutdown();
      pfStack_10398 = (fdb_kvs_handle *)0x110292;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_10398 = (fdb_kvs_handle *)0x1102c3;
      fprintf(_stderr,pcVar8,"forestdb config test");
      return;
    }
  }
  else {
LAB_001102e9:
    pfStack_10398 = (fdb_kvs_handle *)0x1102ee;
    config_test();
LAB_001102ee:
    pfStack_10398 = (fdb_kvs_handle *)0x1102f3;
    config_test();
LAB_001102f3:
    pfStack_10398 = (fdb_kvs_handle *)0x1102f8;
    config_test();
LAB_001102f8:
    pfStack_10398 = (fdb_kvs_handle *)0x1102fd;
    config_test();
LAB_001102fd:
    pfStack_10398 = (fdb_kvs_handle *)0x110302;
    config_test();
  }
  pfStack_10398 = (fdb_kvs_handle *)delete_reopen_test;
  config_test();
  pfStack_104d0 = (fdb_config *)0x11031b;
  pfStack_10398 = fconfig_00;
  gettimeofday(&tStack_104a0,(__timezone_ptr_t)0x0);
  pfStack_104d0 = (fdb_config *)0x110320;
  memleak_start();
  pfStack_104d0 = (fdb_config *)0x11032c;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_104d0 = (fdb_config *)0x110339;
  fdb_get_default_config();
  fStack_10490.buffercache_size = 0;
  fStack_10490.num_compactor_threads = 1;
  pfStack_104d0 = (fdb_config *)0x11035d;
  fVar2 = fdb_open(&pfStack_104c0,"./dummy3",&fStack_10490);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_104d0 = (fdb_config *)0x110376;
    fVar2 = fdb_kvs_open_default(pfStack_104c0,&pfStack_104b8,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011056d;
    pfStack_104d0 = (fdb_config *)0x11038d;
    fVar2 = fdb_begin_transaction(pfStack_104c0,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110572;
    pfStack_104d0 = (fdb_config *)0x1103b8;
    fVar2 = fdb_set_kv(pfStack_104b8,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110577;
    pfStack_104d0 = (fdb_config *)0x1103cc;
    fVar2 = fdb_end_transaction(pfStack_104c0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011057c;
    pfStack_104d0 = (fdb_config *)0x1103f4;
    fVar2 = fdb_get_kv(pfStack_104b8,"foo",3,&piStack_104a8,&sStack_104b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110581;
    if (sStack_104b0 != 5) {
      pfStack_104d0 = (fdb_config *)0x11040e;
      delete_reopen_test();
    }
    if ((char)piStack_104a8[1] != 'e' || *piStack_104a8 != 0x756c6176) goto LAB_00110586;
    pfStack_104d0 = (fdb_config *)0x11042e;
    fdb_free_block(piStack_104a8);
    pfStack_104d0 = (fdb_config *)0x11043d;
    fVar2 = fdb_begin_transaction(pfStack_104c0,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058b;
    pfStack_104d0 = (fdb_config *)0x11045b;
    fVar2 = fdb_del_kv(pfStack_104b8,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110590;
    pfStack_104d0 = (fdb_config *)0x11046f;
    fVar2 = fdb_end_transaction(pfStack_104c0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110595;
    pfStack_104d0 = (fdb_config *)0x110497;
    fVar2 = fdb_get_kv(pfStack_104b8,"foo",3,&piStack_104a8,&sStack_104b0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011059a;
    pfStack_104d0 = (fdb_config *)0x1104aa;
    fVar2 = fdb_close(pfStack_104c0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059f;
    pfStack_104d0 = (fdb_config *)0x1104c8;
    fVar2 = fdb_open(&pfStack_104c0,"./dummy3",&fStack_10490);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a4;
    pfStack_104d0 = (fdb_config *)0x1104e1;
    fVar2 = fdb_kvs_open_default(pfStack_104c0,&pfStack_104b8,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a9;
    pfStack_104d0 = (fdb_config *)0x110509;
    fVar2 = fdb_get_kv(pfStack_104b8,"foo",3,&piStack_104a8,&sStack_104b0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105ae;
    pfStack_104d0 = (fdb_config *)0x11051c;
    fVar2 = fdb_close(pfStack_104c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_104d0 = (fdb_config *)0x110529;
      fdb_shutdown();
      pfStack_104d0 = (fdb_config *)0x11052e;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_104d0 = (fdb_config *)0x11055f;
      fprintf(_stderr,pcVar8,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_104d0 = (fdb_config *)0x11056d;
    delete_reopen_test();
LAB_0011056d:
    pfStack_104d0 = (fdb_config *)0x110572;
    delete_reopen_test();
LAB_00110572:
    pfStack_104d0 = (fdb_config *)0x110577;
    delete_reopen_test();
LAB_00110577:
    pfStack_104d0 = (fdb_config *)0x11057c;
    delete_reopen_test();
LAB_0011057c:
    pfStack_104d0 = (fdb_config *)0x110581;
    delete_reopen_test();
LAB_00110581:
    pfStack_104d0 = (fdb_config *)0x110586;
    delete_reopen_test();
LAB_00110586:
    pfStack_104d0 = (fdb_config *)0x11058b;
    delete_reopen_test();
LAB_0011058b:
    pfStack_104d0 = (fdb_config *)0x110590;
    delete_reopen_test();
LAB_00110590:
    pfStack_104d0 = (fdb_config *)0x110595;
    delete_reopen_test();
LAB_00110595:
    pfStack_104d0 = (fdb_config *)0x11059a;
    delete_reopen_test();
LAB_0011059a:
    pfStack_104d0 = (fdb_config *)0x11059f;
    delete_reopen_test();
LAB_0011059f:
    pfStack_104d0 = (fdb_config *)0x1105a4;
    delete_reopen_test();
LAB_001105a4:
    pfStack_104d0 = (fdb_config *)0x1105a9;
    delete_reopen_test();
LAB_001105a9:
    pfStack_104d0 = (fdb_config *)0x1105ae;
    delete_reopen_test();
LAB_001105ae:
    pfStack_104d0 = (fdb_config *)0x1105b3;
    delete_reopen_test();
  }
  pfStack_104d0 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_10888 = (fdb_config *)0x1105d1;
  pfStack_104d8 = &fStack_10490;
  pfStack_104d0 = pfVar11;
  gettimeofday(&tStack_107e0,(__timezone_ptr_t)0x0);
  pfStack_10888 = (fdb_config *)0x1105d6;
  memleak_start();
  pfStack_10888 = (fdb_config *)0x1105e2;
  system("rm -rf  dummy* > errorlog.txt");
  pvStack_10808 = (void *)0x0;
  auStack_10850._0_8_ = 0;
  auStack_10850._8_8_ = 0;
  auStack_10850._16_8_ = 0;
  auStack_10850._24_8_ = 0;
  uStack_10820 = 0;
  p_Stack_10818 = (fdb_compaction_callback)0x0;
  auStack_10850._32_8_ = auStack_107d0;
  pfStack_10810 = &fStack_106d0;
  fStack_10828 = 0xffffffffffffffff;
  pfVar6 = &fStack_105d0;
  pfStack_10888 = (fdb_config *)0x110631;
  fdb_get_default_config();
  fStack_105d0.purging_interval = 1;
  fStack_105d0.seqtree_opt = '\x01';
  pfStack_10888 = (fdb_config *)0x110649;
  fdb_get_default_kvs_config();
  pfStack_10888 = (fdb_config *)0x11065d;
  fVar2 = fdb_open(&pfStack_10860,"./dummy1",pfVar6);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10888 = (fdb_config *)0x11067e;
    fVar2 = fdb_kvs_open(pfStack_10860,&pfStack_10868,(char *)0x0,&fStack_107f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c7;
    builtin_memcpy(auStack_107d0,"key",4);
    pfVar6 = &fStack_106d0;
    fStack_106d0.chunksize = 0x6f62;
    fStack_106d0._2_2_ = 0x7964;
    fStack_106d0.blocksize._0_1_ = 0;
    pfStack_10888 = (fdb_config *)0x1106ab;
    auStack_10850._0_8_ = strlen((char *)auStack_107d0);
    pfVar11 = (fdb_config *)auStack_10850;
    pfStack_10888 = (fdb_config *)0x1106bb;
    auStack_10850._16_8_ = strlen((char *)pfVar6);
    pfStack_10888 = (fdb_config *)0x1106cc;
    fVar2 = fdb_set(pfStack_10868,(fdb_doc *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108cc;
    pfStack_10888 = (fdb_config *)0x1106e3;
    fVar2 = fdb_commit(pfStack_10860,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d1;
    pfStack_10888 = (fdb_config *)0x1106fa;
    fVar2 = fdb_del(pfStack_10868,(fdb_doc *)auStack_10850);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d6;
    pfStack_10888 = (fdb_config *)0x110711;
    fVar2 = fdb_commit(pfStack_10860,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108db;
    pfVar6 = (fdb_config *)&pfStack_10870;
    pfStack_10888 = (fdb_config *)0x110743;
    fdb_doc_create((fdb_doc **)pfVar6,auStack_107d0,auStack_10850._0_8_,(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_10888 = (fdb_config *)0x110750;
    fVar2 = fdb_get_metaonly(pfStack_10868,pfStack_10870);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e0;
    pfVar9 = pfStack_10870;
    if (pfStack_10870->deleted == false) {
      pfVar6 = (fdb_config *)&pfStack_10858;
      pfStack_10888 = (fdb_config *)0x110775;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10858;
    }
    pfVar9->deleted = false;
    pfStack_10888 = (fdb_config *)0x110786;
    fVar2 = fdb_get_metaonly_byseq(pfStack_10868,pfVar9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e5;
    pfVar9 = pfStack_10870;
    if (pfStack_10870->deleted == false) {
      pfVar6 = (fdb_config *)&pfStack_10858;
      pfStack_10888 = (fdb_config *)0x1107ab;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10858;
    }
    pfVar9->deleted = false;
    pfStack_10888 = (fdb_config *)0x1107bc;
    fVar2 = fdb_get_byoffset(pfStack_10868,pfVar9);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ea;
    pfVar9 = pfStack_10870;
    if (pfStack_10870->deleted == false) {
      pfVar6 = (fdb_config *)&pfStack_10858;
      pfStack_10888 = (fdb_config *)0x1107e2;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10858;
    }
    pfVar9->deleted = false;
    pfStack_10888 = (fdb_config *)0x1107f3;
    fVar2 = fdb_get(pfStack_10868,pfVar9);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ef;
    pfVar9 = pfStack_10870;
    if (pfStack_10870->deleted == true) {
      pfVar6 = (fdb_config *)&pfStack_10858;
      pfStack_10888 = (fdb_config *)0x110819;
      deleted_doc_get_api_test();
      pfVar9 = pfStack_10858;
    }
    pfVar9->deleted = false;
    pfStack_10888 = (fdb_config *)0x11082a;
    fVar2 = fdb_get_byseq(pfStack_10868,pfVar9);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f4;
    if (pfStack_10870->deleted == true) {
      pfVar6 = (fdb_config *)&pfStack_10858;
      pfStack_10888 = (fdb_config *)0x110850;
      deleted_doc_get_api_test();
      pfStack_10870 = pfStack_10858;
    }
    pfStack_10888 = (fdb_config *)0x110858;
    fdb_doc_free(pfStack_10870);
    pfStack_10888 = (fdb_config *)0x110862;
    fVar2 = fdb_kvs_close(pfStack_10868);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f9;
    pfStack_10888 = (fdb_config *)0x110874;
    fVar2 = fdb_close(pfStack_10860);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10888 = (fdb_config *)0x110881;
      fdb_shutdown();
      pfStack_10888 = (fdb_config *)0x110886;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_10888 = (fdb_config *)0x1108b7;
      fprintf(_stderr,pcVar8,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_10888 = (fdb_config *)0x1108c7;
    deleted_doc_get_api_test();
LAB_001108c7:
    pfStack_10888 = (fdb_config *)0x1108cc;
    deleted_doc_get_api_test();
LAB_001108cc:
    pfStack_10888 = (fdb_config *)0x1108d1;
    deleted_doc_get_api_test();
LAB_001108d1:
    pfStack_10888 = (fdb_config *)0x1108d6;
    deleted_doc_get_api_test();
LAB_001108d6:
    pfStack_10888 = (fdb_config *)0x1108db;
    deleted_doc_get_api_test();
LAB_001108db:
    pfStack_10888 = (fdb_config *)0x1108e0;
    deleted_doc_get_api_test();
LAB_001108e0:
    pfStack_10888 = (fdb_config *)0x1108e5;
    deleted_doc_get_api_test();
LAB_001108e5:
    pfStack_10888 = (fdb_config *)0x1108ea;
    deleted_doc_get_api_test();
LAB_001108ea:
    pfStack_10888 = (fdb_config *)0x1108ef;
    deleted_doc_get_api_test();
LAB_001108ef:
    pfStack_10888 = (fdb_config *)0x1108f4;
    deleted_doc_get_api_test();
LAB_001108f4:
    pfStack_10888 = (fdb_config *)0x1108f9;
    deleted_doc_get_api_test();
LAB_001108f9:
    pfStack_10888 = (fdb_config *)0x1108fe;
    deleted_doc_get_api_test();
  }
  pfStack_10888 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pcStack_10c70 = (code *)0x11091c;
  pfStack_10890 = pfVar6;
  pfStack_10888 = pfVar11;
  gettimeofday(&tStack_10be0,(__timezone_ptr_t)0x0);
  pcStack_10c70 = (code *)0x110921;
  memleak_start();
  pcStack_10c70 = (code *)0x11092d;
  system("rm -rf  dummy* > errorlog.txt");
  auStack_10c48._24_8_ = 0;
  pvStack_10c10 = (void *)0x0;
  uStack_10c18 = 0;
  auStack_10c48._8_8_ = 0;
  auStack_10c48._16_8_ = 0;
  uStack_10c00 = 0;
  auStack_10c48._32_8_ = acStack_10a88;
  pfStack_10c08 = &fStack_10b88;
  fStack_10c20 = 0xffffffffffffffff;
  pfVar6 = &fStack_10988;
  pcStack_10c70 = (code *)0x110980;
  fdb_get_default_config();
  fStack_10988.purging_interval = 0;
  pcStack_10c70 = (code *)0x110991;
  fdb_get_default_kvs_config();
  pcStack_10c70 = (code *)0x1109a5;
  fVar2 = fdb_open(&pfStack_10c60,"./dummy1",pfVar6);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_10c70 = (code *)0x1109c8;
    fVar2 = fdb_kvs_open(pfStack_10c60,&pfStack_10c58,"main",&fStack_10bf8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b48;
    acStack_10a88[0] = 'K';
    acStack_10a88[1] = '\0';
    pfVar6 = &fStack_10b88;
    fStack_10b88.chunksize = 0x6f62;
    fStack_10b88._2_2_ = 0x7964;
    fStack_10b88.blocksize._0_1_ = 0;
    pcStack_10c70 = (code *)0x1109f4;
    sVar4 = strlen(acStack_10a88);
    auStack_10c48._0_8_ = sVar4 + 1;
    pfVar11 = (fdb_config *)auStack_10c48;
    pcStack_10c70 = (code *)0x110a07;
    sVar4 = strlen((char *)pfVar6);
    auStack_10c48._16_8_ = sVar4 + 1;
    pcStack_10c70 = (code *)0x110a1b;
    fVar2 = fdb_set(pfStack_10c58,(fdb_doc *)pfVar11);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4d;
    pcStack_10c70 = (code *)0x110a32;
    fVar2 = fdb_del(pfStack_10c58,(fdb_doc *)auStack_10c48);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b52;
    pfVar6 = (fdb_config *)&pfStack_10c50;
    pcStack_10c70 = (code *)0x110a61;
    fdb_doc_create((fdb_doc **)pfVar6,(void *)auStack_10c48._32_8_,auStack_10c48._0_8_,(void *)0x0,0
                   ,(void *)0x0,0);
    pcStack_10c70 = (code *)0x110a6e;
    fVar2 = fdb_get(pfStack_10c58,pfStack_10c50);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b57;
    pcStack_10c70 = (code *)0x110a81;
    fdb_doc_free(pfStack_10c50);
    pcStack_10c70 = (code *)0x110a93;
    fdb_get_file_info(pfStack_10c60,(fdb_file_info *)auStack_10bd0);
    pfVar6 = (fdb_config *)(auStack_10bd0 + 0x10);
    if (auStack_10bd0._16_8_ != 0) {
      pcStack_10c70 = (code *)0x110aa9;
      deleted_doc_stat_test();
    }
    pcStack_10c70 = (code *)0x110ab5;
    fVar2 = fdb_commit(pfStack_10c60,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5c;
    pfVar11 = (fdb_config *)auStack_10bd0;
    pcStack_10c70 = (code *)0x110ad2;
    fdb_get_file_info(pfStack_10c60,(fdb_file_info *)pfVar11);
    if (auStack_10bd0._16_8_ != 0) {
      pcStack_10c70 = (code *)0x110ae1;
      deleted_doc_stat_test();
    }
    pcStack_10c70 = (code *)0x110aeb;
    fVar2 = fdb_kvs_close(pfStack_10c58);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b61;
    pcStack_10c70 = (code *)0x110af9;
    fVar2 = fdb_close(pfStack_10c60);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_10c70 = (code *)0x110b02;
      fdb_shutdown();
      pcStack_10c70 = (code *)0x110b07;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_10c70 = (code *)0x110b38;
      fprintf(_stderr,pcVar8,"deleted doc stat test");
      return;
    }
  }
  else {
    pcStack_10c70 = (code *)0x110b48;
    deleted_doc_stat_test();
LAB_00110b48:
    pcStack_10c70 = (code *)0x110b4d;
    deleted_doc_stat_test();
LAB_00110b4d:
    pcStack_10c70 = (code *)0x110b52;
    deleted_doc_stat_test();
LAB_00110b52:
    pcStack_10c70 = (code *)0x110b57;
    deleted_doc_stat_test();
LAB_00110b57:
    pcStack_10c70 = (code *)0x110b5c;
    deleted_doc_stat_test();
LAB_00110b5c:
    pcStack_10c70 = (code *)0x110b61;
    deleted_doc_stat_test();
LAB_00110b61:
    pcStack_10c70 = (code *)0x110b66;
    deleted_doc_stat_test();
  }
  pcStack_10c70 = complete_delete_test;
  deleted_doc_stat_test();
  pcStack_110f8 = (code *)0x110b88;
  pfStack_10c98 = pfVar6;
  ppfStack_10c90 = unaff_R12;
  pfStack_10c88 = unaff_R13;
  pfStack_10c80 = pfVar11;
  pcStack_10c78 = unaff_R15;
  pcStack_10c70 = (code *)unaff_RBP;
  gettimeofday(&tStack_110c8,(__timezone_ptr_t)0x0);
  pcStack_110f8 = (code *)0x110b8d;
  memleak_start();
  pcVar8 = acStack_10da0;
  builtin_strncpy(acStack_10da0,"./dummy1",9);
  pcStack_110f8 = (code *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_10e98;
  pcStack_110f8 = (code *)0x110bc2;
  fdb_get_default_config();
  fStack_10e98.buffercache_size = 0;
  kvs_config_00 = &fStack_110b8.create_if_missing;
  pcStack_110f8 = (code *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_110d8;
  pcStack_110f8 = (code *)0x110bea;
  fdb_open(ptr_fhandle,pcVar8,pfVar11);
  pcStack_110f8 = (code *)0x110c02;
  fVar2 = fdb_kvs_open(pfStack_110d8,&pfStack_110e0,"db1",(fdb_kvs_config *)kvs_config_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = 0;
  do {
    pcStack_110f8 = (code *)0x110c33;
    sprintf((char *)&fStack_10fa0,"key%05d",unaff_RBP);
    pcStack_110f8 = (code *)0x110c42;
    sprintf((char *)apfStack_110a0,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_110e0;
    pcStack_110f8 = (code *)0x110c4f;
    sVar4 = strlen((char *)&fStack_10fa0);
    pcVar8 = (char *)(sVar4 + 1);
    pcStack_110f8 = (code *)0x110c5b;
    sVar4 = strlen((char *)apfStack_110a0);
    pcStack_110f8 = (code *)0x110c70;
    fVar2 = fdb_set_kv(unaff_R13,&fStack_10fa0,(size_t)pcVar8,apfStack_110a0,sVar4 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_110f8 = (code *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar7 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar7;
  } while (uVar7 != 1000);
  pcStack_110f8 = (code *)0x110c91;
  fdb_commit(pfStack_110d8,'\x01');
  pcVar8 = "key%05d";
  pfVar11 = &fStack_10fa0;
  kvs_config_00 = "value%05d";
  ptr_fhandle = apfStack_110a0;
  unaff_RBP = 0;
  do {
    pcStack_110f8 = (code *)0x110cbd;
    sprintf((char *)pfVar11,"key%05d",unaff_RBP);
    pcStack_110f8 = (code *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_110e0;
    pcStack_110f8 = (code *)0x110cd9;
    sVar4 = strlen((char *)pfVar11);
    pcStack_110f8 = (code *)0x110ce8;
    fVar2 = fdb_del_kv(unaff_R13,pfVar11,sVar4 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar7 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar7;
  } while (uVar7 != 1000);
  pcStack_110f8 = (code *)0x110d09;
  fdb_commit(pfStack_110d8,'\x01');
  pcStack_110f8 = (code *)0x110d29;
  fVar2 = fdb_iterator_init(pfStack_110e0,&pfStack_110d0,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pcStack_110f8 = (code *)0x110d37;
  fVar2 = fdb_iterator_close(pfStack_110d0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_110f8 = (code *)0x110d45;
    fdb_close(pfStack_110d8);
    pcStack_110f8 = (code *)0x110d4a;
    fdb_shutdown();
    pcStack_110f8 = (code *)0x110d4f;
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    pcStack_110f8 = (code *)0x110d80;
    fprintf(_stderr,pcVar8,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar11 = &fStack_10fa0;
  ptr_fhandle = apfStack_110a0;
  kvs_config_00 = "value%05d";
  pcStack_110f8 = (code *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pcStack_110f8 = (code *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pcStack_110f8 = (code *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pcStack_110f8 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11570 = (fdb_config *)0x110dc8;
  pcStack_11120 = pcVar8;
  ppfStack_11118 = ptr_fhandle;
  pfStack_11110 = unaff_R13;
  pfStack_11108 = pfVar11;
  pfStack_11100 = (fdb_kvs_config *)kvs_config_00;
  pcStack_110f8 = (code *)unaff_RBP;
  gettimeofday(&tStack_11538,(__timezone_ptr_t)0x0);
  pfStack_11570 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_11570 = (fdb_config *)0x110dd7;
  pfVar6 = (fdb_config *)malloc(4000000);
  pfStack_11570 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_11420;
  pfStack_11570 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_11570 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_11570 = (fdb_config *)0x110e14;
  fVar2 = fdb_open(&pfStack_11560,"./dummy1",pfVar11);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11570 = (fdb_config *)0x110e32;
    fVar2 = fdb_kvs_open(pfStack_11560,&pfStack_11558,(char *)0x0,&fStack_11550);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar8 = (char *)0x0;
    uVar10 = 0;
    do {
      pfStack_11570 = (fdb_config *)0x110e5b;
      sprintf(acStack_11228,"key%128d",uVar10 & 0xffffffff);
      pfStack_11570 = (fdb_config *)0x110e77;
      sprintf(acStack_11328,"meta%128d",uVar10 & 0xffffffff);
      pfStack_11570 = (fdb_config *)0x110e8d;
      sprintf(acStack_11528,"body%128d",uVar10 & 0xffffffff);
      pfStack_11570 = (fdb_config *)0x110e99;
      sVar4 = strlen(acStack_11228);
      pfStack_11570 = (fdb_config *)0x110ea7;
      metalen = strlen(acStack_11328);
      pfStack_11570 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_11528);
      pfStack_11570 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar8 + (long)&pfVar6->chunksize),acStack_11228,sVar4,
                     acStack_11328,metalen,acStack_11528,bodylen);
      pfStack_11570 = (fdb_config *)0x110eec;
      fdb_set(pfStack_11558,*(fdb_doc **)(&pfVar6->chunksize + uVar10 * 4));
      pfStack_11570 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&pfVar6->chunksize + uVar10 * 4));
      uVar10 = uVar10 + 1;
      pcVar8 = pcVar8 + 8;
    } while (uVar10 != 500000);
    pfStack_11570 = (fdb_config *)0x110f13;
    fVar2 = fdb_kvs_close(pfStack_11558);
    pfVar11 = pfVar6;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_11570 = (fdb_config *)0x110f25;
    fVar2 = fdb_close(pfStack_11560);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_11570 = (fdb_config *)0x110f46;
    fVar2 = fdb_open(&pfStack_11560,"./dummy1",&fStack_11420);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_11570 = (fdb_config *)0x110f65;
      free(pfVar6);
      pfStack_11570 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_11570 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_11570 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar8,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11570 = (fdb_config *)0x110f59;
      fVar2 = fdb_close(pfStack_11560);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_11570 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_11570 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_11570 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_11570 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_11570 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_11570 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_11580 = pcVar8;
  pfStack_11578 = pfVar11;
  pfStack_11570 = pfVar6;
  gettimeofday(&tStack_117a0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_11778.wal_threshold = 0x400;
  fStack_11778.seqtree_opt = '\x01';
  fStack_11778.purging_interval = 1;
  fStack_11778.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_117a8,"./dummy1",&fStack_11778);
  fdb_kvs_open(pfStack_117a8,&pfStack_117b0,"db1",&fStack_11790);
  sprintf(acStack_11680,"key%d",0);
  sVar4 = strlen(acStack_11680);
  fdb_doc_create(&pfStack_117b8,acStack_11680,sVar4,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_117b0,pfStack_117b8);
  fVar2 = fdb_get(pfStack_117b0,pfStack_117b8);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_117b0,pfStack_117b8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_117b0,pfStack_117b8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_117b0,pfStack_117b8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_117b0,pfStack_117b8);
        fVar2 = fdb_get(pfStack_117b0,pfStack_117b8);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_117b8->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_117b0,pfStack_117b8);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_117b8->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_117b0,pfStack_117b8);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_117b8->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_117b0,pfStack_117b8);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_117b8->deleted != false) {
                    fdb_doc_free(pfStack_117b8);
                    fdb_kvs_close(pfStack_117b0);
                    fdb_close(pfStack_117a8);
                    fdb_shutdown();
                    memleak_end();
                    pcVar8 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar8 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar8,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void set_get_max_keylen()
{
    TEST_INIT();
    memleak_start();

    int r;
    static const int len = FDB_MAX_KEYLEN;
    char keybuf[len];
    void *rvalue;
    size_t rvalue_len;
    static const char *achar = "a";

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.chunksize = 16;


    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    for (int i = 0; i < len; ++i) {
        keybuf[i] = *achar;
    }
    keybuf[len-1] = '\0';

    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set kv
    status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get NULL pointer
    status = fdb_get(db, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // get kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get max keylen");
}